

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_protocol.cc
# Opt level: O2

session * __thiscall
helix::nasdaq::nordic_itch_protocol::new_session(nordic_itch_protocol *this,void *data)

{
  bool bVar1;
  moldudp_session<helix::nasdaq::nordic_itch_handler> *this_00;
  invalid_argument *this_01;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __lhs = &this->_name;
  bVar1 = std::operator==(__lhs,"nasdaq-nordic-moldudp-itch");
  if (bVar1) {
    this_00 = (moldudp_session<helix::nasdaq::nordic_itch_handler> *)operator_new(0x120);
    moldudp_session<helix::nasdaq::nordic_itch_handler>::moldudp_session(this_00,data);
  }
  else {
    bVar1 = std::operator==(__lhs,"nasdaq-nordic-soupfile-itch");
    if (!bVar1) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"unknown protocol: ",__lhs);
      std::invalid_argument::invalid_argument(this_01,(string *)&local_40);
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this_00 = (moldudp_session<helix::nasdaq::nordic_itch_handler> *)operator_new(0x118);
    soupfile_session<helix::nasdaq::nordic_itch_handler>::soupfile_session
              ((soupfile_session<helix::nasdaq::nordic_itch_handler> *)this_00,data);
  }
  return &this_00->super_session;
}

Assistant:

session* nordic_itch_protocol::new_session(void *data)
{
    if (_name == "nasdaq-nordic-moldudp-itch") {
        return new moldudp_session<nordic_itch_handler>(data);
    } else if (_name == "nasdaq-nordic-soupfile-itch") {
        return new soupfile_session<nordic_itch_handler>(data);
    } else {
        throw std::invalid_argument("unknown protocol: " + _name);
    }
}